

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::create_pipeline_int8_x86(Convolution_x86 *this,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint _c;
  undefined4 uVar13;
  _func_int **pp_Var14;
  _func_int *p_Var15;
  ulong uVar16;
  size_t sVar17;
  int iVar18;
  undefined4 *puVar19;
  void *pvVar20;
  ulong uVar21;
  int _h;
  ulong uVar22;
  long lVar23;
  long lVar24;
  undefined8 local_80;
  Mat local_78;
  
  pp_Var14 = this->_vptr_Convolution_x86;
  p_Var15 = pp_Var14[-3];
  uVar16 = (long)*(int *)(p_Var15 + 0x2c + (long)&(this->weight_3x3_winograd23_data_int8).data) /
           (long)(*(int *)(p_Var15 + (long)&(this->weight_3x3_winograd23_data_int8).data) *
                 *(int *)(&this->field_0xbc + (long)p_Var15));
  uVar16 = (long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) /
           (long)*(int *)(&this->use_winograd3x3_int8 + (long)p_Var15);
  this->use_winograd3x3_int8 = false;
  if (opt->use_winograd_convolution == true) {
    p_Var15 = pp_Var14[-3];
    if (((((*(int *)(&this->field_0xbc + (long)p_Var15) == 3) &&
          (*(int *)(p_Var15 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 3)) &&
         (*(int *)(p_Var15 + 4 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 1)) &&
        ((*(int *)(p_Var15 + 8 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 1 &&
         (*(int *)(p_Var15 + 0xc + (long)&(this->weight_3x3_winograd23_data_int8).data) == 1)))) &&
       ((*(int *)(p_Var15 + 0x10 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 1 &&
        ((_h = (int)uVar16, 0xf < _h &&
         (0xf < *(int *)(&this->use_winograd3x3_int8 + (long)p_Var15))))))) {
      this->use_winograd3x3_int8 = true;
      p_Var15 = pp_Var14[-3];
      _c = *(uint *)(&this->use_winograd3x3_int8 + (long)p_Var15);
      uVar21 = 0;
      Mat::create(&this->weight_3x3_winograd23_data_int8,0x10,_h,_c,2,(Allocator *)0x0);
      uVar22 = (ulong)_c;
      if ((int)_c < 1) {
        uVar22 = uVar21;
      }
      for (; uVar21 != uVar22; uVar21 = uVar21 + 1) {
        for (local_80 = 0; local_80 != (uVar16 & 0xffffffff); local_80 = local_80 + 1) {
          lVar23 = *(long *)(&this->field_0x138 + (long)p_Var15) + (long)(_h * 9 * (int)uVar21);
          lVar24 = local_80 * 9;
          Mat::channel(&local_78,&this->weight_3x3_winograd23_data_int8,(int)uVar21);
          iVar18 = local_78.w;
          sVar17 = local_78.elemsize;
          pvVar20 = local_78.data;
          Mat::~Mat(&local_78);
          cVar1 = *(char *)(lVar23 + lVar24);
          cVar2 = *(char *)(lVar23 + 1 + lVar24);
          cVar3 = *(char *)(lVar23 + 2 + lVar24);
          cVar4 = *(char *)(lVar23 + 3 + lVar24);
          cVar5 = *(char *)(lVar23 + 4 + lVar24);
          cVar6 = *(char *)(lVar23 + 5 + lVar24);
          cVar7 = *(char *)(lVar23 + 6 + lVar24);
          cVar8 = *(char *)(lVar23 + 7 + lVar24);
          cVar9 = *(char *)(lVar23 + 8 + lVar24);
          for (lVar24 = 4; lVar24 != 0x1c; lVar24 = lVar24 + 6) {
            sVar10 = *(short *)(&UNK_0016588c + lVar24);
            sVar11 = *(short *)(&UNK_0016588e + lVar24);
            sVar12 = *(short *)((long)&DAT_00165890 + lVar24);
            *(short *)((long)&local_80 + lVar24 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_80 + lVar24 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)&local_78.data + lVar24) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
          }
          pvVar20 = (void *)((long)pvVar20 + sVar17 * (long)(iVar18 * (int)local_80));
          for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
            sVar10 = *(short *)((long)&local_78.data + lVar24 * 6);
            uVar13 = *(undefined4 *)((long)&local_78.data + lVar24 * 6 + 2);
            puVar19 = &DAT_00165892;
            for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
              *(short *)((long)pvVar20 + lVar23 * 2) =
                   (short)((uint)*puVar19 >> 0x10) * (short)((uint)uVar13 >> 0x10) +
                   (short)*puVar19 * (short)uVar13 + *(short *)((long)puVar19 + -2) * sVar10;
              puVar19 = (undefined4 *)((long)puVar19 + 6);
            }
            pvVar20 = (void *)((long)pvVar20 + 8);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline_int8_x86(const Option& opt)
{
    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    use_winograd3x3_int8 = false;

    if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1
        && num_input >= 16 && num_output >= 16)
    {
        // winograd is slow on small channel count
        use_winograd3x3_int8 = true;

        conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data_int8, num_input, num_output);
//         conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data_int8, num_input, num_output);
    }
    else
    {
        // TODO offline transform weight
    }

    return 0;
}